

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  undefined8 in_R9;
  int *in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  undefined8 in_stack_00000028;
  int r;
  int *piVar1;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  cubeb_stream_params *in_stack_ffffffffffffff68;
  bool local_71;
  bool local_55;
  int local_54;
  int local_1c;
  
  if ((((in_RDI == (long *)0x0) || (in_RSI == 0)) || (in_stack_00000018 == 0)) ||
     (in_stack_00000020 == 0)) {
    local_1c = -3;
  }
  else {
    local_54 = validate_stream_params
                         (in_stack_ffffffffffffff68,
                          (cubeb_stream_params *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if ((local_54 == 0) && (local_54 = validate_latency(in_stack_00000010), local_54 == 0)) {
      piVar1 = in_stack_00000008;
      local_1c = (**(code **)(*in_RDI + 0x40))
                           (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,
                            in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028)
      ;
      if ((local_1c == -2) &&
         ((g_cubeb_log_callback != (cubeb_log_callback)0x0 &&
          (g_cubeb_log_level != CUBEB_LOG_DISABLED)))) {
        local_55 = false;
        if (in_stack_00000008 != (int *)0x0) {
          local_55 = *in_stack_00000008 != 0;
        }
        local_71 = false;
        if (in_R8 != (int *)0x0) {
          local_71 = *in_R8 != 0;
        }
        (*g_cubeb_log_callback)
                  ("%s:%d: Invalid format, %p %p %d %d\n","cubeb.c",0x172,in_stack_00000008,in_R8,
                   (ulong)local_55,CONCAT44((int)((ulong)piVar1 >> 0x20),(uint)local_71));
      }
    }
    else {
      local_1c = local_54;
    }
  }
  return local_1c;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream, char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) != CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name,
                                input_device,
                                input_stream_params,
                                output_device,
                                output_stream_params,
                                latency,
                                data_callback,
                                state_callback,
                                user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d",
        output_stream_params, input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}